

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O3

void __thiscall
TasGrid::RuleWavelet::getShiftScale(RuleWavelet *this,int point,double *scale,double *shift)

{
  uint uVar1;
  int iVar2;
  int __exponent;
  int iVar3;
  double dVar4;
  
  if (point < 3) {
    dVar4 = getNode(this,point);
    *scale = dVar4;
    dVar4 = -1.0;
  }
  else {
    uVar1 = point - 1U;
    __exponent = -2;
    do {
      iVar2 = __exponent;
      uVar1 = (int)uVar1 >> 1;
      __exponent = iVar2 + 1;
    } while (1 < uVar1);
    iVar3 = 2 << ((char)iVar2 + 2U & 0x1f);
    iVar2 = (int)(point - 1U) % iVar3;
    dVar4 = ldexp(1.0,__exponent);
    *scale = dVar4;
    if (iVar2 == 0) {
      dVar4 = -2.0;
    }
    else if (iVar2 == iVar3 + -1) {
      dVar4 = -3.0;
    }
    else {
      dVar4 = (double)(iVar2 + -1) * 0.5;
    }
  }
  *shift = dVar4;
  return;
}

Assistant:

void RuleWavelet::getShiftScale(int point, double &scale, double &shift) const{
    if (point < 3){
        scale = getNode(point);
        shift = -1.0;
    }else{
        int l = Maths::intlog2(point - 1);
        int subindex = (point - 1) % (1 << l);
        scale = std::pow(2,l-2);
        if (subindex == 0){
            shift = -2.0;
        }else if (subindex == (1 << l) - 1){
            shift = -3.0;
        }else{
            shift = 0.5 * (double (subindex - 1));
        }
    }
}